

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_max_u_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ushort uVar4;
  ushort uVar5;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  uVar5 = (ushort)(env->active_fpu).fpr[wt].fs[0];
  uVar4 = (ushort)(env->active_fpu).fpr[ws].fs[0];
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((env->active_fpu).fpr + wd) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 2);
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 2);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 2) = uVar4;
  uVar5 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 4);
  uVar4 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 4);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 4) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 6);
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 6);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 6) = uVar4;
  uVar5 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 8);
  uVar4 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 8);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 8) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 10);
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 10);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 10) = uVar4;
  uVar5 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  uVar4 = (ushort)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 0xc) = uVar4;
  uVar4 = *(ushort *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  uVar5 = *(ushort *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  if (uVar4 < uVar5) {
    uVar4 = uVar5;
  }
  *(ushort *)((long)(env->active_fpu).fpr + lVar1 + 0xe) = uVar4;
  return;
}

Assistant:

void helper_msa_max_u_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_max_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_max_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_max_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_max_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_max_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_max_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_max_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_max_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}